

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
           *this)

{
  size_t *psVar1;
  size_t i_00;
  bool bVar2;
  ctrl_t cVar3;
  pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
  *ts;
  size_t sVar4;
  size_t sVar5;
  allocator_type *paVar6;
  FindInfo FVar7;
  undefined1 local_90 [8];
  anon_class_16_2_3fe0aac9 probe_index;
  size_t new_i;
  FindInfo target;
  undefined1 local_60 [8];
  size_t hash;
  size_t i;
  slot_type *slot;
  type raw;
  raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
  *this_local;
  
  raw._48_8_ = this;
  bVar2 = IsValidCapacity(this->capacity_);
  if (!bVar2) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x748,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
                 );
  }
  bVar2 = is_small(this);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,this->capacity_);
    i = (size_t)&slot;
    hash = 0;
    do {
      if (hash == this->capacity_) {
        reset_growth_left(this);
        return;
      }
      bVar2 = IsDeleted(this->ctrl_[hash]);
      if (bVar2) {
        target.probe_length = (size_t)hash_ref(this);
        ts = hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
             ::
             element<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>
                       (this->slots_ + hash);
        local_60 = (undefined1  [8])
                   hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
                   ::
                   apply<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,phmap::container_internal::HashEq<void*,void>::Hash,phmap::container_internal::HashEq<void*,void>::Eq,std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>::HashElement,std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>&,phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>
                             ((HashElement *)&target.probe_length,ts);
        FVar7 = find_first_non_full(this,(size_t)local_60);
        new_i = FVar7.offset;
        probe_index.hash = (size_t *)new_i;
        probe_index.this =
             (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void_*,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>,_phmap::container_internal::HashEq<void_*,_void>::Hash,_phmap::container_internal::HashEq<void_*,_void>::Eq,_std::allocator<std::pair<void_*const,_VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>_>_>
              *)local_60;
        local_90 = (undefined1  [8])this;
        sVar4 = drop_deletes_without_resize::anon_class_16_2_3fe0aac9::operator()
                          ((anon_class_16_2_3fe0aac9 *)local_90,new_i);
        sVar5 = drop_deletes_without_resize::anon_class_16_2_3fe0aac9::operator()
                          ((anon_class_16_2_3fe0aac9 *)local_90,hash);
        i_00 = hash;
        if (sVar4 == sVar5) {
          cVar3 = H2((size_t)local_60);
          set_ctrl(this,i_00,cVar3);
        }
        else {
          bVar2 = IsEmpty(this->ctrl_[(long)probe_index.hash]);
          psVar1 = probe_index.hash;
          if (bVar2) {
            cVar3 = H2((size_t)local_60);
            set_ctrl(this,(size_t)psVar1,cVar3);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
            ::
            transfer<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                      (paVar6,this->slots_ + (long)probe_index.hash,this->slots_ + hash);
            set_ctrl(this,hash,-0x80);
          }
          else {
            bVar2 = IsDeleted(this->ctrl_[(long)probe_index.hash]);
            psVar1 = probe_index.hash;
            if (!bVar2) {
              __assert_fail("IsDeleted(ctrl_[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                            ,0x779,
                            "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
                           );
            }
            cVar3 = H2((size_t)local_60);
            set_ctrl(this,(size_t)psVar1,cVar3);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
            ::
            transfer<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                      (paVar6,(slot_type *)i,this->slots_ + hash);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
            ::
            transfer<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                      (paVar6,this->slots_ + hash,this->slots_ + (long)probe_index.hash);
            paVar6 = alloc_ref(this);
            hash_policy_traits<phmap::container_internal::FlatHashMapPolicy<void*,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>,void>
            ::
            transfer<std::allocator<std::pair<void*const,VectorClock<std::allocator<std::pair<unsigned_long_const,unsigned_long>>>>>>
                      (paVar6,this->slots_ + (long)probe_index.hash,(slot_type *)i);
            hash = hash - 1;
          }
        }
      }
      hash = hash + 1;
    } while( true );
  }
  __assert_fail("!is_small()",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x749,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, phmap::container_internal::HashEq<void *>::Hash, phmap::container_internal::HashEq<void *>::Eq, std::allocator<std::pair<void *const, VectorClock<>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<void *, VectorClock<>>, Hash = phmap::container_internal::HashEq<void *>::Hash, Eq = phmap::container_internal::HashEq<void *>::Eq, Alloc = std::allocator<std::pair<void *const, VectorClock<>>>]"
               );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename std::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hash = PolicyTraits::apply(HashElement{hash_ref()},
                                              PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hash);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hash.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hash).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hash));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hash));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hash));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left();
    }